

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseStageMeta
          (AsciiParser *this,pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *out)

{
  bool bVar1;
  value_type *rhs;
  ostream *poVar2;
  ListEditQual qual;
  string varname;
  MetaVariable var;
  value_type vardef;
  optional<tinyusdz::ascii::AsciiParser::VariableDef> pvardef;
  
  bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar1) {
    return false;
  }
  qual = ResetToExplicit;
  bVar1 = MaybeListEditQual(this,&qual);
  if (!bVar1) {
    return false;
  }
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (!bVar1) {
    return false;
  }
  varname._M_dataplus._M_p = (pointer)&varname.field_2;
  varname._M_string_length = 0;
  varname.field_2._M_local_buf[0] = '\0';
  bVar1 = ReadIdentifier(this,&varname);
  if (bVar1) {
    bVar1 = IsStageMeta(this,&varname);
    if (bVar1) {
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (bVar1) {
        bVar1 = Expect(this,'=');
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&pvardef);
          poVar2 = ::std::operator<<((ostream *)&pvardef,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseStageMeta");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbe8);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)&pvardef,"`=` expected.");
          ::std::operator<<(poVar2,"\n");
          goto LAB_002969b6;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (bVar1) {
          GetStageMetaDefinition
                    ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)&vardef,this,&varname);
          nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
          optional<tinyusdz::ascii::AsciiParser::VariableDef,_0>
                    (&pvardef,(optional<tinyusdz::ascii::AsciiParser::VariableDef> *)&vardef);
          nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::~optional
                    ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)&vardef);
          if (pvardef.has_value_ == true) {
            rhs = nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                  operator*(&pvardef);
            VariableDef::VariableDef(&vardef,rhs);
            var._name._M_dataplus._M_p = (pointer)&var._name.field_2;
            var._value.v_.vtable =
                 (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            var._value.v_.storage.dynamic = (void *)0x0;
            var._name._M_string_length = 0;
            var._name.field_2._M_local_buf[0] = '\0';
            bVar1 = ParseMetaValue(this,&vardef,&var);
            if (bVar1) {
              ::std::__cxx11::string::_M_assign((string *)&var._name);
              out->first = qual;
              MetaVariable::operator=(&out->second,&var);
            }
            MetaVariable::~MetaVariable(&var);
            VariableDef::~VariableDef(&vardef);
          }
          else {
            bVar1 = false;
          }
          nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::~optional
                    (&pvardef);
          goto LAB_002969e8;
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&pvardef);
      poVar2 = ::std::operator<<((ostream *)&pvardef,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseStageMeta");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbe0);
      ::std::operator<<(poVar2," ");
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var,
                       "Unsupported or invalid/empty variable name `",&varname);
      ::std::operator+(&vardef.type,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var,
                       "` for Stage metadatum");
      poVar2 = ::std::operator<<((ostream *)&pvardef,(string *)&vardef);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
LAB_002969b6:
      ::std::__cxx11::stringbuf::str();
      PushError(this,&vardef.type);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pvardef);
    }
  }
  bVar1 = false;
LAB_002969e8:
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool AsciiParser::ParseStageMeta(std::pair<ListEditQual, MetaVariable> *out) {
  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  tinyusdz::ListEditQual qual{ListEditQual::ResetToExplicit};
  if (!MaybeListEditQual(&qual)) {
    return false;
  }

  DCOUT("list-edit qual: " << tinyusdz::to_string(qual));

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return false;
  }

  // std::cout << "varname = `" << varname << "`\n";

  if (!IsStageMeta(varname)) {
    PUSH_ERROR_AND_RETURN("Unsupported or invalid/empty variable name `" +
                          varname + "` for Stage metadatum");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect('=')) {
    PUSH_ERROR_AND_RETURN("`=` expected.");
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  auto pvardef = GetStageMetaDefinition(varname);
  if (!pvardef) {
    // This should not happen though;
    return false;
  }

  auto vardef = (*pvardef);

  MetaVariable var;
  if (!ParseMetaValue(vardef, &var)) {
    return false;
  }
  var.set_name(varname);

  std::get<0>(*out) = qual;
  std::get<1>(*out) = var;

  return true;
}